

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O0

basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> * __thiscall
ptc::Print<char16_t>::operator()
          (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
           *__return_storage_ptr__,Print<char16_t> *this,mode *first,char (*args) [8],
          char (*args_1) [5])

{
  int iVar1;
  allocator<char> local_a1;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  conditional_t<std::is_same_v<char16_t,_char>,_const_std::basic_string<char16_t>_&,_std::basic_string<char16_t>_>
  local_60;
  char (*local_30) [5];
  char (*args_local_1) [5];
  char (*args_local) [8];
  mode *first_local;
  Print<char16_t> *this_local;
  
  local_30 = args_1;
  args_local_1 = (char (*) [5])args;
  args_local = (char (*) [8])first;
  first_local = (mode *)this;
  this_local = (Print<char16_t> *)__return_storage_ptr__;
  if (*first == str) {
    if (operator()<char_const(&)[8],char_const(&)[5]>(ptc::mode&&,char_const&[],char_const&[])::
        oss_abi_cxx11_ == '\0') {
      iVar1 = __cxa_guard_acquire(&operator()<char_const(&)[8],char_const(&)[5]>(ptc::mode&&,char_const&[],char_const&[])
                                   ::oss_abi_cxx11_);
      if (iVar1 != 0) {
        std::__cxx11::
        basic_ostringstream<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
        basic_ostringstream(&operator()<char_const(&)[8],char_const(&)[5]>(ptc::mode&&,char_const&[],char_const&[])
                             ::oss_abi_cxx11_);
        __cxa_atexit(std::__cxx11::
                     basic_ostringstream<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                     ::~basic_ostringstream,
                     &operator()<char_const(&)[8],char_const(&)[5]>(ptc::mode&&,char_const&[],char_const&[])
                      ::oss_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&operator()<char_const(&)[8],char_const(&)[5]>(ptc::mode&&,char_const&[],char_const&[])
                             ::oss_abi_cxx11_);
      }
    }
    s_abi_cxx11_(&local_80,"",0);
    anon_unknown_8::StringConverter<char16_t>(&local_60,&local_80);
    std::__cxx11::
    basic_ostringstream<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::str
              (&operator()<char_const(&)[8],char_const(&)[5]>(ptc::mode&&,char_const&[],char_const&[])
                ::oss_abi_cxx11_,&local_60);
    std::__cxx11::u16string::~u16string((u16string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::basic_ios<char16_t,_std::char_traits<char16_t>_>::clear
              ((basic_ios<char16_t,_std::char_traits<char16_t>_> *)
               (operator()<char_const(&)[8],char_const(&)[5]>(ptc::mode&&,char_const&[],char_const&[])
                ::oss_abi_cxx11_.super_basic_ostream<char16_t,_std::char_traits<char16_t>_>.
                _vptr_basic_ostream[-3] + 0x1b12d0),_S_goodbit);
    print_backend<std::__cxx11::basic_ostringstream<char16_t,std::char_traits<char16_t>,std::allocator<char16_t>>&,char_const(&)[8],char_const(&)[5]>
              (this,&operator()<char_const(&)[8],char_const(&)[5]>(ptc::mode&&,char_const&[],char_const&[])
                     ::oss_abi_cxx11_,(char (*) [8])args_local_1,local_30);
    std::__cxx11::
    basic_ostringstream<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::str
              (__return_storage_ptr__,
               &operator()<char_const(&)[8],char_const(&)[5]>(ptc::mode&&,char_const&[],char_const&[])
                ::oss_abi_cxx11_);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"",&local_a1);
    anon_unknown_8::StringConverter<char16_t>(__return_storage_ptr__,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::basic_string<T_str> operator()( mode&& first, Args&&... args ) const
     { 
      if constexpr( sizeof...( args ) > 0 )
       {
        switch( first )
         {
          case mode::str:
           {
            static std::basic_ostringstream<T_str> oss;
            oss.str( StringConverter<T_str>( ""s ) );
            oss.clear();
            print_backend( oss, std::forward<Args>( args )... );

            return oss.str();
           }
         }
       }
       
      return StringConverter<T_str>( "" );
     }